

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O0

void C_NameKeys(char *str,int first,int second)

{
  char *pcVar1;
  int local_1c;
  int c;
  int second_local;
  int first_local;
  char *str_local;
  
  local_1c = 0;
  *str = '\0';
  if (first != 0) {
    local_1c = 1;
    pcVar1 = KeyName(first);
    strcpy(str,pcVar1);
    if (second != 0) {
      strcat(str," or ");
    }
  }
  if (second != 0) {
    local_1c = local_1c + 1;
    pcVar1 = KeyName(second);
    strcat(str,pcVar1);
  }
  if (local_1c == 0) {
    *str = '\0';
  }
  return;
}

Assistant:

void C_NameKeys (char *str, int first, int second)
{
	int c = 0;

	*str = 0;
	if (first)
	{
		c++;
		strcpy (str, KeyName (first));
		if (second)
			strcat (str, " or ");
	}

	if (second)
	{
		c++;
		strcat (str, KeyName (second));
	}

	if (!c)
		*str = '\0';
}